

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

bool __thiscall
cmFileInstaller::InstallFile
          (cmFileInstaller *this,string *fromFile,string *toFile,MatchProperties match_properties)

{
  char *pcVar1;
  bool bVar2;
  __type _Var3;
  byte bVar4;
  Status SVar5;
  string *this_00;
  bool bVar6;
  string newFromFile;
  string oldSymlinkTarget;
  string toDir;
  string reassembled;
  string e;
  cmAlphaNum local_60;
  
  if (this->InstallMode == COPY) {
    bVar6 = cmFileCopier::InstallFile(&this->super_cmFileCopier,fromFile,toFile,match_properties);
    return bVar6;
  }
  newFromFile._M_dataplus._M_p = (pointer)&newFromFile.field_2;
  newFromFile._M_string_length = 0;
  newFromFile.field_2._M_local_buf[0] = '\0';
  if (this->InstallMode - REL_SYMLINK < 4) {
    cmsys::SystemTools::GetParentDirectory(&toDir,toFile);
    cmSystemTools::ForceToRelativePath(&oldSymlinkTarget,&toDir,fromFile);
    this_00 = &oldSymlinkTarget;
    std::__cxx11::string::operator=((string *)&newFromFile,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    cmsys::SystemTools::CollapseFullPath(&reassembled,&newFromFile,&toDir);
    bVar2 = cmsys::SystemTools::ComparePath(&reassembled,fromFile);
    bVar6 = true;
    if (!bVar2) {
      if (this->InstallMode - SYMLINK < 2) {
        std::__cxx11::string::_M_assign((string *)&newFromFile);
      }
      else if (this->InstallMode == REL_SYMLINK_OR_COPY) {
        bVar6 = cmFileCopier::InstallFile
                          (&this->super_cmFileCopier,fromFile,toFile,match_properties);
        this_00 = (string *)(ulong)bVar6;
        bVar6 = false;
      }
      else {
        pcVar1 = (this->super_cmFileCopier).Name;
        oldSymlinkTarget._M_dataplus._M_p = (pointer)strlen(pcVar1);
        local_60.View_._M_len = 0x30;
        local_60.View_._M_str = " cannot determine relative path for symlink to \"";
        oldSymlinkTarget._M_string_length = (size_type)pcVar1;
        cmStrCat<std::__cxx11::string,char[7],std::__cxx11::string,char[3]>
                  (&e,(cmAlphaNum *)&oldSymlinkTarget,&local_60,&newFromFile,
                   (char (*) [7])"\" at \"",toFile,(char (*) [3])0x617de4);
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
        std::__cxx11::string::~string((string *)&e);
        bVar6 = false;
        this_00 = (string *)0x0;
      }
    }
    bVar4 = (byte)this_00;
    std::__cxx11::string::~string((string *)&reassembled);
    std::__cxx11::string::~string((string *)&toDir);
    if (!bVar6) goto LAB_003c3e32;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&newFromFile);
  }
  bVar6 = true;
  if ((this->super_cmFileCopier).Always == false) {
    oldSymlinkTarget._M_dataplus._M_p = (pointer)&oldSymlinkTarget.field_2;
    oldSymlinkTarget._M_string_length = 0;
    oldSymlinkTarget.field_2._M_local_buf[0] = '\0';
    SVar5 = cmsys::SystemTools::ReadSymlink(toFile,&oldSymlinkTarget);
    bVar6 = true;
    if (SVar5.Kind_ == Success) {
      _Var3 = std::operator==(&newFromFile,&oldSymlinkTarget);
      bVar6 = !_Var3;
    }
    std::__cxx11::string::~string((string *)&oldSymlinkTarget);
  }
  (*(this->super_cmFileCopier)._vptr_cmFileCopier[5])(this,toFile,2,(ulong)bVar6);
  bVar4 = 1;
  if (bVar6 != false) {
    cmsys::SystemTools::RemoveFile(toFile);
    cmsys::SystemTools::GetFilenamePath(&oldSymlinkTarget,toFile);
    cmsys::SystemTools::MakeDirectory(&oldSymlinkTarget,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)&oldSymlinkTarget);
    SVar5 = cmSystemTools::CreateSymlink(&newFromFile,toFile);
    if (SVar5.Kind_ != Success) {
      if ((this->InstallMode < (SYMLINK_OR_COPY|ABS_SYMLINK)) &&
         ((0x54U >> (this->InstallMode & 0x1f) & 1) != 0)) {
        bVar4 = cmFileCopier::InstallFile
                          (&this->super_cmFileCopier,&newFromFile,toFile,match_properties);
      }
      else {
        pcVar1 = (this->super_cmFileCopier).Name;
        oldSymlinkTarget._M_dataplus._M_p = (pointer)strlen(pcVar1);
        local_60.View_._M_len = 0x1b;
        local_60.View_._M_str = " cannot create symlink to \"";
        oldSymlinkTarget._M_string_length = (size_type)pcVar1;
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        cmStrCat<std::__cxx11::string,char[7],std::__cxx11::string,char[4],std::__cxx11::string,char[3]>
                  (&toDir,(cmAlphaNum *)&oldSymlinkTarget,&local_60,&newFromFile,
                   (char (*) [7])"\" at \"",toFile,(char (*) [4])0x62d153,&reassembled,
                   (char (*) [3])0x617de4);
        std::__cxx11::string::~string((string *)&reassembled);
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
        std::__cxx11::string::~string((string *)&toDir);
        bVar4 = 0;
      }
    }
  }
LAB_003c3e32:
  std::__cxx11::string::~string((string *)&newFromFile);
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmFileInstaller::InstallFile(const std::string& fromFile,
                                  const std::string& toFile,
                                  MatchProperties match_properties)
{
  if (this->InstallMode == cmInstallMode::COPY) {
    return this->cmFileCopier::InstallFile(fromFile, toFile, match_properties);
  }

  std::string newFromFile;

  if (this->InstallMode == cmInstallMode::REL_SYMLINK ||
      this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY ||
      this->InstallMode == cmInstallMode::SYMLINK ||
      this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
    // Try to get a relative path.
    std::string toDir = cmSystemTools::GetParentDirectory(toFile);
    newFromFile = cmSystemTools::ForceToRelativePath(toDir, fromFile);

    // Double check that we can restore the original path.
    std::string reassembled =
      cmSystemTools::CollapseFullPath(newFromFile, toDir);
    if (!cmSystemTools::ComparePath(reassembled, fromFile)) {
      if (this->InstallMode == cmInstallMode::SYMLINK ||
          this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
        // User does not mind, silently proceed with absolute path.
        newFromFile = fromFile;
      } else if (this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY) {
        // User expects a relative symbolic link or a copy.
        // Since an absolute symlink won't do, copy instead.
        return this->cmFileCopier::InstallFile(fromFile, toFile,
                                               match_properties);
      } else {
        // We cannot meet user's expectation (REL_SYMLINK)
        auto e = cmStrCat(this->Name,
                          " cannot determine relative path for symlink to \"",
                          newFromFile, "\" at \"", toFile, "\".");
        this->Status.SetError(e);
        return false;
      }
    }
  } else {
    newFromFile = fromFile; // stick with absolute path
  }

  // Compare the symlink value to that at the destination if not
  // always installing.
  bool copy = true;
  if (!this->Always) {
    std::string oldSymlinkTarget;
    if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
      if (newFromFile == oldSymlinkTarget) {
        copy = false;
      }
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeLink, copy);

  if (copy) {
    // Remove the destination file so we can always create the symlink.
    cmSystemTools::RemoveFile(toFile);

    // Create destination directory if it doesn't exist
    cmSystemTools::MakeDirectory(cmSystemTools::GetFilenamePath(toFile));

    // Create the symlink.
    if (!cmSystemTools::CreateSymlink(newFromFile, toFile)) {
      if (this->InstallMode == cmInstallMode::ABS_SYMLINK_OR_COPY ||
          this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY ||
          this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
        // Failed to create a symbolic link, fall back to copying.
        return this->cmFileCopier::InstallFile(newFromFile, toFile,
                                               match_properties);
      }

      auto e = cmStrCat(this->Name, " cannot create symlink to \"",
                        newFromFile, "\" at \"", toFile,
                        "\": ", cmSystemTools::GetLastSystemError(), "\".");
      this->Status.SetError(e);
      return false;
    }
  }

  return true;
}